

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O3

ssize_t __thiscall
event_track::EventMessageInstanceBox::write
          (EventMessageInstanceBox *this,int __fd,void *__buf,size_t __n)

{
  size_type sVar1;
  size_type sVar2;
  pointer puVar3;
  int iVar4;
  size_t sVar5;
  pointer puVar6;
  uint uVar7;
  undefined4 in_register_00000034;
  char *pcVar8;
  char cVar9;
  int k;
  pointer puVar10;
  ulong uVar11;
  char int_buf [4];
  char long_buf [8];
  uint local_3c;
  ulong local_38;
  
  pcVar8 = (char *)CONCAT44(in_register_00000034,__fd);
  iVar4 = std::__cxx11::string::compare((char *)&this->scheme_id_uri_);
  sVar5 = size(this);
  uVar7 = (uint)sVar5;
  local_3c = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  std::ostream::write(pcVar8,(long)&local_3c);
  cVar9 = (char)__fd;
  if (iVar4 == 0) {
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    uVar7 = (*(int *)&(this->message_data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
            *(int *)&(this->message_data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) + 8;
    uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
    local_3c = uVar7;
    std::ostream::write(pcVar8,(long)&local_3c);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    if ((this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar11 = 0;
      do {
        std::ostream::put(cVar9);
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)((long)(this->message_data_).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->message_data_).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
    }
    local_3c = uVar7;
    std::ostream::write(pcVar8,(long)&local_3c);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    puVar3 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0x10;
    if ((this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      std::ostream::write(pcVar8,(long)puVar3);
    }
  }
  else {
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    std::ostream::put(cVar9);
    local_3c = 0;
    std::ostream::write(pcVar8,(long)&local_3c);
    uVar11 = this->presentation_time_delta_;
    local_38 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
               (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
               (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 | (uVar11 & 0xff00) << 0x28
               | uVar11 << 0x38;
    std::ostream::write(pcVar8,(long)&local_38);
    uVar7 = this->event_duration_;
    local_3c = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    std::ostream::write(pcVar8,(long)&local_3c);
    uVar7 = this->id_;
    local_3c = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    std::ostream::write(pcVar8,(long)&local_3c);
    std::ostream::write(pcVar8,(long)(this->scheme_id_uri_)._M_dataplus._M_p);
    sVar1 = (this->scheme_id_uri_)._M_string_length;
    std::ostream::write(pcVar8,(long)(this->value_)._M_dataplus._M_p);
    sVar2 = (this->value_)._M_string_length;
    puVar3 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar10 = puVar6;
    if (puVar6 != puVar3) {
      std::ostream::write(pcVar8,(long)puVar3);
      puVar6 = (this->message_data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar10 = (this->message_data_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    uVar11 = (ulong)((((int)puVar10 + (int)sVar2 + (int)sVar1) - (int)puVar6) + 0x22);
  }
  return uVar11;
}

Assistant:

size_t write(std::ostream &ostr)
		{
			char int_buf[4];
			char long_buf[8];
			uint32_t bytes_written = 0;

			// write as webvtt
			if (scheme_id_uri_.compare("urn:webvtt") == 0) 
			{
				uint32_t sz = (uint32_t)this->size();
				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;

				ostr.put('v');
				ostr.put('t');
				ostr.put('t');
				ostr.put('c');
				bytes_written += 4;

				sz = message_data_.size() + 8;
				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;
				ostr.put('i');
				ostr.put('d');
				ostr.put('e');
				ostr.put('n');

				if (message_data_.size())
				{
					for (int k = 0; k < message_data_.size(); k++)
                    {
					   char c = (char) message_data_[k];
					   if (c != ' ')
					      ostr.put(c);
					   else 
						  ostr.put('-');

					}					
				}
					

				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;

				ostr.put('p');
				ostr.put('a');
				ostr.put('y');
				ostr.put('l');

				if (message_data_.size())
					ostr.write((char*)&message_data_[0], message_data_.size());

			}
			else {
				uint32_t sz = (uint32_t)this->size();
				fmp4_write_uint32(sz, int_buf);
				ostr.write((char*)int_buf, 4);
				bytes_written += 4;

				ostr.put('e');
				ostr.put('m');
				ostr.put('i');
				ostr.put('b');
				bytes_written += 4;
				ostr.put((uint8_t)0);
				ostr.put(0u);
				ostr.put(0u);
				ostr.put(0u);
				bytes_written += 4;

				fmp4_write_uint32(0, int_buf);
				ostr.write(int_buf, 4);
				bytes_written += 4;
				fmp4_write_int64(presentation_time_delta_, long_buf);
				ostr.write(long_buf, 8);
				bytes_written += 8;
				fmp4_write_uint32(event_duration_, int_buf);
				ostr.write(int_buf, 4);
				bytes_written += 4;
				fmp4_write_uint32(id_, int_buf);
				ostr.write(int_buf, 4);
				bytes_written += 4;
				ostr.write(scheme_id_uri_.c_str(), scheme_id_uri_.size() + 1);
				bytes_written += (uint32_t)scheme_id_uri_.size() + 1;
				ostr.write(value_.c_str(), value_.size() + 1);
				bytes_written += (uint32_t)value_.size() + 1;

				if (message_data_.size())
					ostr.write((char*)&message_data_[0], message_data_.size());

				bytes_written += (uint32_t)message_data_.size();
			}
			return bytes_written;
		}